

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O0

void RegisterParameter(UnityAudioEffectDefinition *definition,char *name,char *unit,float minval,
                      float maxval,float defaultval,float displayscale,float displayexponent,
                      int enumvalue,char *description)

{
  char *local_50;
  char *local_48;
  char *description_local;
  int enumvalue_local;
  float displayexponent_local;
  float displayscale_local;
  float defaultval_local;
  float maxval_local;
  float minval_local;
  char *unit_local;
  char *name_local;
  UnityAudioEffectDefinition *definition_local;
  
  if (defaultval < minval) {
    __assert_fail("defaultval >= minval",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginUtil.cpp"
                  ,0x147,
                  "void RegisterParameter(UnityAudioEffectDefinition &, const char *, const char *, float, float, float, float, float, int, const char *)"
                 );
  }
  if (defaultval <= maxval) {
    strcpy(definition->paramdefs[enumvalue].name,name);
    strcpy(definition->paramdefs[enumvalue].unit,unit);
    if (description == (char *)0x0) {
      if (name == (char *)0x0) {
        local_50 = (char *)0x0;
      }
      else {
        local_50 = strnew(name);
      }
      local_48 = local_50;
    }
    else {
      local_48 = strnew(description);
    }
    definition->paramdefs[enumvalue].description = local_48;
    definition->paramdefs[enumvalue].defaultval = defaultval;
    definition->paramdefs[enumvalue].displayscale = displayscale;
    definition->paramdefs[enumvalue].displayexponent = displayexponent;
    definition->paramdefs[enumvalue].min = minval;
    definition->paramdefs[enumvalue].max = maxval;
    if ((int)definition->numparameters <= enumvalue) {
      definition->numparameters = enumvalue + 1;
    }
    return;
  }
  __assert_fail("defaultval <= maxval",
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginUtil.cpp"
                ,0x148,
                "void RegisterParameter(UnityAudioEffectDefinition &, const char *, const char *, float, float, float, float, float, int, const char *)"
               );
}

Assistant:

void RegisterParameter(
    UnityAudioEffectDefinition& definition,
    const char* name,
    const char* unit,
    float minval,
    float maxval,
    float defaultval,
    float displayscale,
    float displayexponent,
    int enumvalue,
    const char* description
    )
{
    assert(defaultval >= minval);
    assert(defaultval <= maxval);
    strcpy_s(definition.paramdefs[enumvalue].name, name);
    strcpy_s(definition.paramdefs[enumvalue].unit, unit);
    definition.paramdefs[enumvalue].description = (description != NULL) ? strnew(description) : (name != NULL) ? strnew(name) : NULL;
    definition.paramdefs[enumvalue].defaultval = defaultval;
    definition.paramdefs[enumvalue].displayscale = displayscale;
    definition.paramdefs[enumvalue].displayexponent = displayexponent;
    definition.paramdefs[enumvalue].min = minval;
    definition.paramdefs[enumvalue].max = maxval;
    if (enumvalue >= (int)definition.numparameters)
        definition.numparameters = enumvalue + 1;
}